

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O0

void __thiscall ktx::CommandExtract::saveEXR::EXRStruct::~EXRStruct(EXRStruct *this)

{
  EXRImage *in_RDI;
  vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *unaff_retaddr;
  EXRHeader *in_stack_ffffffffffffffe8;
  EXRImage *exr_image;
  
  exr_image = in_RDI;
  if (in_RDI[3].tiles != (EXRTile *)0x0) {
    free(in_RDI[3].tiles);
    in_RDI[3].tiles = (EXRTile *)0x0;
    in_RDI[2].num_tiles = 0;
  }
  in_RDI[4].width = 0;
  in_RDI[4].height = 0;
  FreeEXRImage(exr_image);
  FreeEXRHeader(in_stack_ffffffffffffffe8);
  FreeEXRErrorMessage((char *)0x27211a);
  free(in_RDI[6].images);
  std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

~EXRStruct() {
            if (header.custom_attributes != nullptr) {
                free(header.custom_attributes);
                header.custom_attributes = nullptr;
                header.num_custom_attributes = 0;
            }
            image.images = nullptr; // null out the images to stop TinyEXR from trying to free them
            FreeEXRImage(&image);
            FreeEXRHeader(&header);
            FreeEXRErrorMessage(err);
            free(fileData);
        }